

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Congestion.cpp
# Opt level: O3

void __thiscall Congestion::Congestion(Congestion *this,int advertisedSize)

{
  this->advertisedSize = advertisedSize;
  this->cwnd = 1.0;
  this->ssthresh = 16.0;
  this->dupAck = 0;
  this->isSlowStart = true;
  this->RTTs = 50000.0;
  this->RTTd = 0.0;
  this->RTO = 0.0;
  return;
}

Assistant:

Congestion::Congestion(int advertisedSize) {
    this->advertisedSize = advertisedSize;
    this->cwnd = 1;
    this->ssthresh = 16;
    this->dupAck = 0;
    this->isSlowStart = true;
    this->RTTs = INIT_SEC;
    this->RTTd = 0;
    this->RTO = 0;
}